

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelController.cpp
# Opt level: O0

string * __thiscall
cali::ChannelController::name_abi_cxx11_(string *__return_storage_ptr__,ChannelController *this)

{
  element_type *peVar1;
  ChannelController *this_local;
  
  peVar1 = std::
           __shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mP);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)peVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ChannelController::name() const
{
    return mP->name;
}